

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test.hpp
# Opt level: O0

bool libtest::unit_test<libtest::a_plus_b>::run_test<(anonymous_namespace)::ac>
               (usize small_gen_num,usize large_gen_num,bool testcase_cache)

{
  pair<unsigned_long,_unsigned_long> pVar1;
  usize failed;
  usize passed;
  pair<unsigned_long,_unsigned_long> result;
  bool testcase_cache_local;
  usize large_gen_num_local;
  usize small_gen_num_local;
  
  cprintf<libtest::ansi_sgr,char_const*>((ansi_sgr)0x24,"[==========] ");
  cprintf<libtest::ansi_sgr,char_const*,char_const*,char_const*>
            ((ansi_sgr)0x100000025,"Start (problem=\"%\",solution=\"%\")\n","A+B","AC");
  gen(small_gen_num,large_gen_num,testcase_cache);
  pVar1 = test<(anonymous_namespace)::ac>(small_gen_num,large_gen_num);
  passed = pVar1.first;
  result.first = pVar1.second;
  cprintf<libtest::ansi_sgr,char_const*>((ansi_sgr)0x24,"[----------] ");
  cprintf<libtest::ansi_sgr,char_const*>((ansi_sgr)0x100000025,"Summarize results\n");
  if (passed != 0) {
    cprintf<libtest::ansi_sgr,char_const*>((ansi_sgr)0x100000020,"[  PASSED  ] ");
    cprintf<libtest::ansi_sgr,char_const*,unsigned_long>((ansi_sgr)0x25,"% cases\n",passed);
  }
  if (result.first != 0) {
    cprintf<libtest::ansi_sgr,char_const*>((ansi_sgr)0x100000020,"[  FAILED  ] ");
    cprintf<libtest::ansi_sgr,char_const*,unsigned_long>((ansi_sgr)0x25,"% cases\n",result.first);
  }
  cprintf<libtest::ansi_sgr,char_const*>((ansi_sgr)0x24,"[==========] ");
  cprintf<libtest::ansi_sgr,char_const*,char_const*,char_const*>
            ((ansi_sgr)0x100000025,"End (problem=\"%\",solution=\"%\")\n\n","A+B","AC");
  return result.first == 0;
}

Assistant:

static bool run_test(const usize small_gen_num, const usize large_gen_num, const bool testcase_cache = false)
    {
        cprintf(base_color, "[==========] "), cprintf(bold_message_color, "Start (problem=\"%\",solution=\"%\")\n", Problem::name, Solution::name);
        gen(small_gen_num, large_gen_num, testcase_cache);
        const auto result  = test<Solution>(small_gen_num, large_gen_num);
        const usize passed = result.first, failed = result.second;
        cprintf(base_color, "[----------] "), cprintf(bold_message_color, "Summarize results\n");
        if (passed > 0) { cprintf(passed_color, "[  PASSED  ] "), cprintf(message_color, "% cases\n", passed); }
        if (failed > 0) { cprintf(passed_color, "[  FAILED  ] "), cprintf(message_color, "% cases\n", failed); }
        cprintf(base_color, "[==========] "), cprintf(bold_message_color, "End (problem=\"%\",solution=\"%\")\n\n", Problem::name, Solution::name);
        return failed == 0;
    }